

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O3

int gost_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  undefined4 uVar2;
  char *__s2;
  long lVar3;
  ossl_gost_cipher_ctx *c;
  int iVar4;
  
  if (type < 0x1e) {
    if (type == 6) {
      uVar2 = EVP_CIPHER_CTX_get_key_length();
      iVar1 = RAND_priv_bytes(ptr,uVar2);
      if (0 < iVar1) {
        return 1;
      }
      iVar4 = 0x7e;
      iVar1 = 0x488;
      goto LAB_00117f95;
    }
    if (type == 7) {
      if (ptr != (void *)0x0) {
        __s2 = get_gost_engine_param(1);
        uVar2 = 0x3dd;
        if (__s2 != (char *)0x0) {
          iVar1 = strcmp("md_gost12_256",__s2);
          if (iVar1 == 0) {
            uVar2 = 0x3dc;
          }
          else {
            iVar1 = strcmp("md_gost12_512",__s2);
            if (iVar1 != 0) {
              iVar1 = strcmp("md_gost94",__s2);
              uVar2 = 0x3dd;
              if (iVar1 == 0) {
                uVar2 = 0x32a;
              }
            }
          }
        }
        *(undefined4 *)ptr = uVar2;
        return 1;
      }
      return 0;
    }
  }
  else {
    if (type == 0x1e) {
      if (ptr == (void *)0x0) {
        return 0;
      }
      c = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
      if (c == (ossl_gost_cipher_ctx *)0x0) {
        return -1;
      }
      if (c->count != 0) {
        return -1;
      }
      iVar1 = OBJ_txt2nid((char *)ptr);
      if (iVar1 == 0) {
        return 0;
      }
      iVar4 = c->key_meshing;
      iVar1 = gost_cipher_set_param(c,iVar1);
      c->key_meshing = iVar4;
      return iVar1;
    }
    if (type == 0x20) {
      lVar3 = EVP_CIPHER_CTX_get_cipher_data();
      if (lVar3 == 0) {
        return -1;
      }
      if (*(int *)(lVar3 + 4) != 0) {
        return -1;
      }
      *(int *)(lVar3 + 8) = arg;
      return 1;
    }
  }
  iVar4 = 0x82;
  iVar1 = 0x4cd;
LAB_00117f95:
  ERR_GOST_error(0x6a,iVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                 ,iVar1);
  return -1;
}

Assistant:

static int gost_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:
        {
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_GOST_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
        }
    case EVP_CTRL_PBE_PRF_NID:
        if (ptr) {
            const char *params = get_gost_engine_param(GOST_PARAM_PBE_PARAMS);
            int nid = NID_id_tc26_hmac_gost_3411_2012_512;

            if (params) {
                if (!strcmp("md_gost12_256", params))
                    nid = NID_id_tc26_hmac_gost_3411_2012_256;
                else if (!strcmp("md_gost12_512", params))
                    nid = NID_id_tc26_hmac_gost_3411_2012_512;
                else if (!strcmp("md_gost94", params))
                    nid = NID_id_HMACGostR3411_94;
            }
            *((int *)ptr) = nid;
            return 1;
        } else {
            return 0;
        }

    case EVP_CTRL_SET_SBOX:
        if (ptr) {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);
            int nid;
            int cur_meshing;
            int ret;

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            nid = OBJ_txt2nid(ptr);
            if (nid == NID_undef) {
                return 0;
            }

            cur_meshing = c->key_meshing;
            ret = gost_cipher_set_param(c, nid);
            c->key_meshing = cur_meshing;
            return ret;
        } else {
            return 0;
        }
    case EVP_CTRL_KEY_MESH:
        {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            c->key_meshing = arg;
            return 1;
        }
    default:
        GOSTerr(GOST_F_GOST_CIPHER_CTL, GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}